

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

void draw_statuses(nh_player_info *pi,nh_bool threeline)

{
  int iVar1;
  attr_t aVar2;
  size_t sVar3;
  undefined8 uVar4;
  int local_2c;
  int local_28;
  int color;
  attr_t colorattr;
  int k;
  int j;
  int i;
  nh_bool threeline_local;
  nh_player_info *pi_local;
  
  if (statuswin == (WINDOW_conflict *)0x0) {
    local_2c = -1;
  }
  else {
    local_2c = statuswin->_maxx + 1;
  }
  colorattr = local_2c + 1;
  k = 0;
  do {
    if (pi->nr_items <= k) {
      return;
    }
    local_28 = 0xf;
    sVar3 = strlen(pi->statusitems[k]);
    colorattr = colorattr - ((int)sVar3 + 1);
    color = 0;
    while (statuscolors[color].name != (char *)0x0) {
      iVar1 = strcmp(pi->statusitems[k],statuscolors[color].name);
      if (iVar1 == 0) {
        local_28 = statuscolors[color].color;
        break;
      }
      color = color + 1;
    }
    aVar2 = curses_color_attr(local_28,0);
    uVar4 = 1;
    if (threeline != '\0') {
      uVar4 = 2;
    }
    wmove(statuswin,uVar4,colorattr);
    wattr_on(statuswin,aVar2,0);
    wprintw(statuswin,"%s",pi->statusitems + k);
    wattr_off(statuswin,aVar2,0);
    k = k + 1;
  } while( true );
}

Assistant:

static void draw_statuses(const struct nh_player_info *pi, nh_bool threeline)
{
    int i, j, k;

    j = getmaxx(statuswin) + 1;
    for (i = 0; i < pi->nr_items; i++) {
	attr_t colorattr;
	int color = CLR_WHITE;
	j -= strlen(pi->statusitems[i]) + 1;
	for (k = 0; statuscolors[k].name; k++) {
	    if (!strcmp(pi->statusitems[i], statuscolors[k].name)) {
		color = statuscolors[k].color;
		break;
	    }
	}
	colorattr = curses_color_attr(color, 0);
	wmove(statuswin, (threeline ? 2 : 1), j);
	wattron(statuswin, colorattr);
	wprintw(statuswin, "%s", pi->statusitems[i]);
	wattroff(statuswin, colorattr);
    }
}